

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::constructAggregate
          (HlslParseContext *this,TIntermNode *node,TType *type,int paramCount,TSourceLoc *loc)

{
  TIntermediate *this_00;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermTyped *pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *this_01;
  TPoolAllocator *pTVar4;
  char *__end;
  undefined1 in_stack_fffffffffffffeb8 [12];
  undefined8 in_stack_fffffffffffffec8;
  undefined1 *puVar5;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 local_108 [16];
  TPoolAllocator *local_f8;
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  TPoolAllocator *local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  TPoolAllocator *local_a8;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  TString local_80;
  TString local_58;
  
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  pTVar3 = TIntermediate::addConversion
                     (this_00,EOpConstructStruct,type,(TIntermTyped *)CONCAT44(extraout_var,iVar2));
  if (pTVar3 != (TIntermTyped *)0x0) {
    iVar2 = (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar3);
    bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_00,iVar2),type);
    if (bVar1) {
      return pTVar3;
    }
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  this_01 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xf0))
                               ((long *)CONCAT44(extraout_var_01,iVar2));
  pTVar4 = GetThreadPoolAllocator();
  puVar5 = local_108;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &stack0xfffffffffffffee0,"","");
  local_a8 = GetThreadPoolAllocator();
  local_a0 = local_90;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a8,""
             ,"");
  name._M_dataplus._M_p = (pointer)&local_a8;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xfffffffffffffee0;
  name._16_12_ = in_stack_fffffffffffffeb8;
  name.field_2._M_allocated_capacity._4_4_ = paramCount;
  name.field_2._8_8_ = in_stack_fffffffffffffec8;
  structName._M_dataplus._M_p = (pointer)this;
  structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)loc;
  structName._M_string_length = (size_type)pTVar4;
  structName.field_2._M_allocated_capacity = (size_type)puVar5;
  structName.field_2._8_8_ = in_stack_fffffffffffffef0;
  TType::getCompleteString(&local_58,this_01,false,true,true,true,name,structName);
  local_d0 = GetThreadPoolAllocator();
  local_c8 = local_b8;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_d0,""
             ,"");
  local_f8 = GetThreadPoolAllocator();
  local_f0 = local_e0;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_f8,""
             ,"");
  name_00._M_dataplus._M_p = (pointer)&local_f8;
  name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_d0;
  name_00._16_12_ = in_stack_fffffffffffffeb8;
  name_00.field_2._M_allocated_capacity._4_4_ = paramCount;
  name_00.field_2._8_8_ = local_58._M_dataplus._M_p;
  structName_00._M_dataplus._M_p = (pointer)this;
  structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)loc;
  structName_00._M_string_length = (size_type)pTVar4;
  structName_00.field_2._M_allocated_capacity = (size_type)puVar5;
  structName_00.field_2._8_8_ = in_stack_fffffffffffffef0;
  TType::getCompleteString(&local_80,type,false,true,true,true,name_00,structName_00);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"","constructor","cannot convert parameter %d from \'%s\' to \'%s\'",
             (ulong)(uint)paramCount,local_58._M_dataplus._M_p,local_80._M_dataplus._M_p);
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::constructAggregate(TIntermNode* node, const TType& type, int paramCount,
                                                   const TSourceLoc& loc)
{
    // Handle cases that map more 1:1 between constructor arguments and constructed.
    TIntermTyped* converted = intermediate.addConversion(EOpConstructStruct, type, node->getAsTyped());
    if (converted == nullptr || converted->getType() != type) {
        error(loc, "", "constructor", "cannot convert parameter %d from '%s' to '%s'", paramCount,
            node->getAsTyped()->getType().getCompleteString().c_str(), type.getCompleteString().c_str());

        return nullptr;
    }

    return converted;
}